

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyUtil.c
# Opt level: O2

void Ivy_ManCollectCut(Ivy_Man_t *p,Ivy_Obj_t *pRoot,Vec_Int_t *vLeaves,Vec_Int_t *vNodes)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  int iVar3;
  
  vNodes->nSize = 0;
  for (iVar3 = 0; iVar3 < vLeaves->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vLeaves,iVar3);
    Vec_IntPush(vNodes,iVar1);
    pIVar2 = Ivy_ManObj(p,iVar1);
    pIVar2->field_0x8 = pIVar2->field_0x8 | 0x10;
  }
  Ivy_ManCollectCut_rec(p,pRoot,vNodes);
  for (iVar3 = 0; iVar3 < vNodes->nSize; iVar3 = iVar3 + 1) {
    iVar1 = Vec_IntEntry(vNodes,iVar3);
    pIVar2 = Ivy_ManObj(p,iVar1);
    pIVar2->field_0x8 = pIVar2->field_0x8 & 0xef;
  }
  return;
}

Assistant:

void Ivy_ManCollectCut( Ivy_Man_t * p, Ivy_Obj_t * pRoot, Vec_Int_t * vLeaves, Vec_Int_t * vNodes )
{
    int i, Leaf;
    // collect and mark the leaves
    Vec_IntClear( vNodes );
    Vec_IntForEachEntry( vLeaves, Leaf, i )
    {
        Vec_IntPush( vNodes, Leaf );
        Ivy_ManObj(p, Leaf)->fMarkA = 1;
    }
    // collect and mark the nodes
    Ivy_ManCollectCut_rec( p, pRoot, vNodes );
    // clean the nodes
    Vec_IntForEachEntry( vNodes, Leaf, i )
        Ivy_ManObj(p, Leaf)->fMarkA = 0;
}